

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall FxPostIncrDecr::FxPostIncrDecr(FxPostIncrDecr *this,FxExpression *base,int token)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_PostIncrDecr,&base->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxPostIncrDecr_00705b90;
  this->Token = token;
  this->Base = base;
  return;
}

Assistant:

FxPostIncrDecr::FxPostIncrDecr(FxExpression *base, int token)
: FxExpression(EFX_PostIncrDecr, base->ScriptPosition), Token(token), Base(base)
{
}